

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.hpp
# Opt level: O0

SquareMatrix<std::complex<double>_> __thiscall
qclab::qgates::RotationY<std::complex<double>_>::matrix(RotationY<std::complex<double>_> *this)

{
  complex<double> m10;
  complex<double> m11;
  undefined8 uVar1;
  undefined8 extraout_RDX;
  data_type extraout_RDX_00;
  QRotationGate1<std::complex<double>_> *in_RSI;
  undefined8 in_R8;
  double in_XMM0_Qa;
  double dVar2;
  double __x;
  double __x_00;
  double __x_01;
  SquareMatrix<std::complex<double>_> SVar3;
  complex<double> m00;
  complex<double> m01;
  undefined8 in_stack_ffffffffffffff88;
  QRotationGate1<std::complex<double>_> *this_00;
  RotationY<std::complex<double>_> *pRVar4;
  complex<double> local_58;
  complex<double> local_48;
  complex<double> local_38;
  complex<double> local_28;
  RotationY<std::complex<double>_> *this_local;
  
  this_00 = in_RSI;
  pRVar4 = this;
  this_local = this;
  dVar2 = QRotationGate1<std::complex<double>_>::cos(in_RSI,in_XMM0_Qa);
  std::complex<double>::complex(&local_28,dVar2,0.0);
  dVar2 = QRotationGate1<std::complex<double>_>::sin(this_00,__x);
  uVar1 = 0x8000000000000000;
  std::complex<double>::complex(&local_38,-dVar2,0.0);
  dVar2 = QRotationGate1<std::complex<double>_>::sin(this_00,__x_00);
  std::complex<double>::complex(&local_48,dVar2,0.0);
  dVar2 = QRotationGate1<std::complex<double>_>::cos(this_00,__x_01);
  std::complex<double>::complex(&local_58,dVar2,0.0);
  m10._M_value._8_8_ = this_00;
  m10._M_value._0_8_ = in_stack_ffffffffffffff88;
  m11._M_value._8_8_ = pRVar4;
  m11._M_value._0_8_ = this;
  m00._M_value._8_8_ = extraout_RDX;
  m00._M_value._0_8_ = in_RSI;
  m01._M_value._8_8_ = in_R8;
  m01._M_value._0_8_ = uVar1;
  dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)this,m00,m01,m10,m11);
  SVar3.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       extraout_RDX_00._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  SVar3.size_ = (size_type_conflict)pRVar4;
  return SVar3;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          return qclab::dense::SquareMatrix< T >( this->cos() , -this->sin() ,
                                                  this->sin() ,  this->cos() ) ;
        }